

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShader_gl_PointSize_ValueTest::iterate(GeometryShader_gl_PointSize_ValueTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  uchar local_5a9;
  undefined1 local_5a8 [120];
  ios_base local_530 [264];
  uchar result_image [1024];
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x3d9);
LAB_00d01c80:
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((this->super_TestCaseBase).m_is_geometry_shader_point_size_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader point size functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x3de);
    goto LAB_00d01c80;
  }
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x1680))(this->m_program_object_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Failed to use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,999);
  (**(code **)(lVar5 + 0x1c0))(0,0,0,0);
  (**(code **)(lVar5 + 0x188))(0x4000);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not clear the color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x3ec);
  (**(code **)(lVar5 + 0x538))(0,0,2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Call drawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x3f0);
  (**(code **)(lVar5 + 0x1220))(0,0,0x10,0x10,0x1908,0x1401,result_image);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not read back pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x3f5);
  bVar2 = TestCaseBase::comparePixel
                    (&this->super_TestCaseBase,result_image,2,8,0x10,0x10,4,0xff,0xff,0xff,0xff);
  if (bVar2) {
    bVar2 = TestCaseBase::comparePixel
                      (&this->super_TestCaseBase,result_image,0xe,8,0x10,0x10,4,0xff,0xff,0xff,0xff)
    ;
    if (bVar2) {
      bVar2 = TestCaseBase::comparePixel
                        (&this->super_TestCaseBase,result_image,6,8,0x10,0x10,4,'\0','\0','\0','\0')
      ;
      if (bVar2) {
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Pass";
        testResult = QP_TEST_RESULT_PASS;
        goto LAB_00d01c08;
      }
      local_5a8._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_5a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Rendered data [",0xf);
      local_5a9 = result_image[0x218];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      local_5a9 = result_image[0x219];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      local_5a9 = result_image[0x21a];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      local_5a9 = result_image[0x21b];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"is different from reference data [0, 0, 0, 0]!",0x2e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_5a8._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_5a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Rendered data [",0xf);
      local_5a9 = result_image[0x238];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      local_5a9 = result_image[0x239];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      local_5a9 = result_image[0x23a];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      local_5a9 = result_image[0x23b];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," is different from reference data [255, 255, 255, 255]!",0x37);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_5a8._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_5a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Rendered data [",0xf);
    local_5a9 = result_image[0x208];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    local_5a9 = result_image[0x209];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    local_5a9 = result_image[0x20a];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    local_5a9 = result_image[0x20b];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_5a9,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," is different from reference data [255, 255, 255, 255]!",0x37);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_5a8 + 8));
  std::ios_base::~ios_base(local_530);
  this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00d01c08:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShader_gl_PointSize_ValueTest::iterate()
{
	/* Buffer to store results of rendering */
	unsigned char result_image[m_texture_width * m_texture_height * m_texture_pixel_size];

	/* This test should only run if EXT_geometry_shader is supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	if (true != m_is_geometry_shader_point_size_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_POINT_SIZE_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Render */
	gl.useProgram(m_program_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to use program");

	gl.clearColor(0 /* red */, 0 /* green */, 0 /* blue */, 0 /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer");

	gl.drawArrays(GL_POINTS, 0 /* first */, 2 /* count */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Call drawArrays() failed");

	/* Check if the data was modified during the rendering process */
	gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, result_image);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixels from color buffer");

	/* 1) pixel at (2,  8) is (255, 255, 255, 255) */
	unsigned int referencePixelCoordinates[2] = { 2, 8 };

	if (false == comparePixel(result_image, referencePixelCoordinates[0] /* x */, referencePixelCoordinates[1] /* y */,
							  m_texture_width, m_texture_height, m_texture_pixel_size, 255 /* red */, 255 /* green */,
							  255 /* blue */, 255 /* alpha */))
	{
		const unsigned int texel_offset = referencePixelCoordinates[1] * m_texture_width * m_texture_pixel_size +
										  referencePixelCoordinates[0] * m_texture_pixel_size;

		m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data [" << result_image[texel_offset + 0] << ", "
						   << result_image[texel_offset + 1] << ", " << result_image[texel_offset + 2] << ", "
						   << result_image[texel_offset + 3] << "]"
						   << " is different from reference data [255, 255, 255, 255]!" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* 2) pixel at (14, 8) is (255, 255, 255, 255) */
	referencePixelCoordinates[0] = 14;
	referencePixelCoordinates[1] = 8;

	if (false == comparePixel(result_image, referencePixelCoordinates[0] /* x */, referencePixelCoordinates[1] /* y */,
							  m_texture_width, m_texture_height, m_texture_pixel_size, 255 /* red */, 255 /* green */,
							  255 /* blue */, 255 /* alpha */))
	{
		const unsigned int texel_offset = referencePixelCoordinates[1] * m_texture_width * m_texture_pixel_size +
										  referencePixelCoordinates[0] * m_texture_pixel_size;

		m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data [" << result_image[texel_offset + 0] << ", "
						   << result_image[texel_offset + 1] << ", " << result_image[texel_offset + 2] << ", "
						   << result_image[texel_offset + 3] << "]"
						   << " is different from reference data [255, 255, 255, 255]!" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* 3) pixel at (6,  8) is (0,   0,   0,   0) */
	referencePixelCoordinates[0] = 6;
	referencePixelCoordinates[1] = 8;

	if (false == comparePixel(result_image, referencePixelCoordinates[0] /* x */, referencePixelCoordinates[1] /* y */,
							  m_texture_width, m_texture_height, m_texture_pixel_size, 0 /* red */, 0 /* green */,
							  0 /* blue */, 0 /* alpha */))
	{
		const unsigned int texel_offset = referencePixelCoordinates[1] * m_texture_width * m_texture_pixel_size +
										  referencePixelCoordinates[0] * m_texture_pixel_size;

		m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data [" << result_image[texel_offset + 0] << ", "
						   << result_image[texel_offset + 1] << ", " << result_image[texel_offset + 2] << ", "
						   << result_image[texel_offset + 3] << "]"
						   << "is different from reference data [0, 0, 0, 0]!" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* Done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}